

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

String * __thiscall String::compress(String *__return_storage_ptr__,String *this)

{
  size_type sVar1;
  int iVar2;
  uint uVar3;
  z_stream stream;
  char buffer [32768];
  
  if ((this->mString)._M_string_length != 0) {
    stream.adler = 0;
    stream.reserved = 0;
    stream.opaque = (voidpf)0x0;
    stream.data_type = 0;
    stream._92_4_ = 0;
    stream.zalloc = (alloc_func)0x0;
    stream.zfree = (free_func)0x0;
    stream.msg = (char *)0x0;
    stream.state = (internal_state *)0x0;
    stream.avail_out = 0;
    stream._36_4_ = 0;
    stream.total_out = 0;
    stream.total_in = 0;
    stream.next_out = (Bytef *)0x0;
    stream.next_in = (Bytef *)0x0;
    stream.avail_in = 0;
    stream._12_4_ = 0;
    iVar2 = deflateInit_(&stream,9,"1.2.11",0x70);
    if (iVar2 == 0) {
      stream.next_in = (Bytef *)(this->mString)._M_dataplus._M_p;
      sVar1 = (this->mString)._M_string_length;
      (__return_storage_ptr__->mString)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->mString).field_2;
      (__return_storage_ptr__->mString)._M_string_length = 0;
      stream.avail_in = (uInt)sVar1;
      (__return_storage_ptr__->mString).field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
      do {
        stream.avail_out = 0x8000;
        stream.next_out = (Bytef *)buffer;
        uVar3 = deflate(&stream,4);
        if (1 < uVar3) {
          (__return_storage_ptr__->mString)._M_string_length = 0;
          *(__return_storage_ptr__->mString)._M_dataplus._M_p = '\0';
          break;
        }
        append(__return_storage_ptr__,buffer,(long)(int)(0x8000 - stream.avail_out));
      } while (stream.avail_out == 0);
      deflateEnd(&stream);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->mString)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mString).field_2;
  (__return_storage_ptr__->mString)._M_string_length = 0;
  (__return_storage_ptr__->mString).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

String String::compress() const
{
#ifndef RCT_HAVE_ZLIB
    assert(0 && "Rct configured without zlib support");
    return String();
#else
    if (isEmpty())
        return String();
    z_stream stream;
    memset(&stream, 0, sizeof(stream));

    if (::deflateInit(&stream, Z_BEST_COMPRESSION) != Z_OK)
        return String();

    stream.next_in = const_cast<Bytef*>(reinterpret_cast<const Bytef *>(data()));
    stream.avail_in = size();

    char buffer[BufferSize];

    String out;
    out.reserve(size() / 2);

    int error = 0;
    do {
        stream.next_out = reinterpret_cast<Bytef *>(buffer);
        stream.avail_out = sizeof(buffer);

        error = ::deflate(&stream, Z_FINISH);
        if (error != Z_OK && error != Z_STREAM_END) {
            out.clear();
            break;
        }

        const int processed = sizeof(buffer) - stream.avail_out;
        out.append(buffer, processed);
    } while (!stream.avail_out);

    deflateEnd(&stream);

    return out;
#endif
}